

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O3

void __thiscall CLIListener::do_discover(CLIListener *this,Poll *p)

{
  uint64_t uVar1;
  MultiQuery<dto::Simple,_dto::Complex> *pMVar2;
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  string empty;
  Simple dto;
  undefined1 local_141;
  MultiQuery<dto::Simple,_dto::Complex> *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  long local_130;
  shared_ptr<Subscriber> local_120;
  long *local_110;
  long local_108;
  long local_100 [2];
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  int local_cc;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Subscriber::set_expected(&this->super_Subscriber,0);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = 0;
  uVar1 = this->cmd_seq;
  this->cmd_seq = uVar1 + 1;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HELLO","");
  local_140 = (MultiQuery<dto::Simple,_dto::Complex> *)&local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_110,local_108 + (long)local_110);
  local_50._M_p = (pointer)&local_40;
  local_68._16_2_ = 0;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68._10_6_ = 0;
  local_68[8] = '\0';
  local_68[9] = '\0';
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f0);
  pMVar2 = local_140;
  strcpy(local_68,(char *)local_140);
  local_68._10_6_ = (undefined6)uVar1;
  local_68._16_2_ = (undefined2)(uVar1 >> 0x30);
  if (pMVar2 != (MultiQuery<dto::Simple,_dto::Complex> *)&local_130) {
    operator_delete(pMVar2,local_130 + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  local_cc = this->timeout_sec * 1000;
  local_140 = (MultiQuery<dto::Simple,_dto::Complex> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MultiQuery<dto::Simple,dto::Complex>,std::allocator<MultiQuery<dto::Simple,dto::Complex>>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int>
            (&local_138,&local_140,(allocator<MultiQuery<dto::Simple,_dto::Complex>_> *)&local_141,
             (Simple *)local_68,&this->port,&this->mcast_addr,&local_cc);
  local_120.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_140->super_Subscriber;
  local_120.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_138._M_pi;
  if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
    }
  }
  Poll::subscribe(p,&local_120);
  if (local_120.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pMVar2 = local_140;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(code **)local_88._M_unused._0_8_ = on_discover_result;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(CLIListener **)((long)local_88._M_unused._0_8_ + 0x10) = this;
  pcStack_70 = std::
               _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(dto::Complex_&,_sockaddr_in)>_>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(dto::Complex_&,_sockaddr_in)>_>
             ::_M_manager;
  MultiQuery<dto::Simple,_dto::Complex>::when_response(pMVar2,(OnResponse *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pMVar2 = local_140;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = operator_new(0x20);
  *(code **)local_a8._M_unused._0_8_ = unblock_input;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(Poll **)((long)local_a8._M_unused._0_8_ + 0x10) = p;
  *(CLIListener **)((long)local_a8._M_unused._0_8_ + 0x18) = this;
  pcStack_90 = std::
               _Function_handler<void_(),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)>_>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)>_>
             ::_M_manager;
  MultiQuery<dto::Simple,_dto::Complex>::when_error(pMVar2,(OnError *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  pMVar2 = local_140;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = operator_new(0x20);
  *(code **)local_c8._M_unused._0_8_ = unblock_input;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(Poll **)((long)local_c8._M_unused._0_8_ + 0x10) = p;
  *(CLIListener **)((long)local_c8._M_unused._0_8_ + 0x18) = this;
  pcStack_b0 = std::
               _Function_handler<void_(),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)>_>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)>_>
             ::_M_manager;
  MultiQuery<dto::Simple,_dto::Complex>::when_timeout(pMVar2,(OnTimeout *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return;
}

Assistant:

void CLIListener::do_discover(Poll &p) {
  block_input(p);
  auto empty = std::string();
  auto dto = dto::create(cmd_seq++, "HELLO", empty);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, mcast_addr, timeout_sec * 1000);
  p.subscribe(query);
  auto unblock = std::bind(&CLIListener::unblock_input, this, std::ref(p));
  query->when_response(std::bind(&CLIListener::on_discover_result, this, _1, _2));
  query->when_error(unblock);
  query->when_timeout(unblock);
}